

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O2

void __thiscall QUrl::setQuery(QUrl *this,QString *query,ParsingMode mode)

{
  uchar *puVar1;
  bool bVar2;
  
  detach(this);
  QUrlPrivate::clearError(this->d);
  QUrlPrivate::setQuery<QString_const&>(this->d,query,mode);
  if ((query->d).ptr == (char16_t *)0x0) {
    puVar1 = &this->d->sectionIsPresent;
    *puVar1 = *puVar1 & 0xbf;
  }
  else if (mode == StrictMode) {
    bVar2 = QUrlPrivate::validateComponent(this->d,Query,query);
    if (!bVar2) {
      QString::clear(&this->d->query);
      return;
    }
  }
  return;
}

Assistant:

void QUrl::setQuery(const QString &query, ParsingMode mode)
{
    detach();
    d->clearError();

    d->setQuery(query, mode);
    if (query.isNull())
        d->sectionIsPresent &= ~QUrlPrivate::Query;
    else if (mode == StrictMode && !d->validateComponent(QUrlPrivate::Query, query))
        d->query.clear();
}